

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_Base.cpp
# Opt level: O3

void __thiscall mbc::Val::ValBase::~ValBase(ValBase *this)

{
  int *piVar1;
  string *psVar2;
  pointer pcVar3;
  
  this->_vptr_ValBase = (_func_int **)&PTR__ValBase_0013f6a0;
  piVar1 = this->count_;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  operator_delete(piVar1);
  psVar2 = this->invaild_waring_;
  if ((psVar2 != (string *)0x0) &&
     (pcVar3 = (psVar2->_M_dataplus)._M_p,
     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)pcVar3 != &psVar2->field_2)) {
    operator_delete(pcVar3);
  }
  operator_delete(psVar2);
  operator_delete(this->is_vaild_);
  operator_delete(this->type_);
  return;
}

Assistant:

ValBase::~ValBase() {
    -- *count_;
    if(*count_ == 0) {
        delete count_;
        delete invaild_waring_;
        delete is_vaild_;
        delete type_;
    }
}